

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabEponymousTableClear(sqlite3 *db,Module *pMod)

{
  Table *pTable;
  Table *pTab;
  Module *pMod_local;
  sqlite3 *db_local;
  
  pTable = pMod->pEpoTab;
  if (pTable != (Table *)0x0) {
    pTable->tabFlags = pTable->tabFlags | 2;
    sqlite3DeleteTable(db,pTable);
    pMod->pEpoTab = (Table *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabEponymousTableClear(sqlite3 *db, Module *pMod){
  Table *pTab = pMod->pEpoTab;
  if( pTab!=0 ){
    /* Mark the table as Ephemeral prior to deleting it, so that the
    ** sqlite3DeleteTable() routine will know that it is not stored in 
    ** the schema. */
    pTab->tabFlags |= TF_Ephemeral;
    sqlite3DeleteTable(db, pTab);
    pMod->pEpoTab = 0;
  }
}